

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *this,char *__file,__off_t __length)

{
  long lVar1;
  ulong uVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  
  lVar1 = *(long *)this;
  while (uVar2 = *(ulong *)(this + 8), (ulong)((long)__file * 0x20 + lVar1) < uVar2) {
    *(ulong *)(this + 8) = uVar2 - 0x20;
    Array<char>::~Array((Array<char> *)(uVar2 - 0x18));
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }